

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ijgp.cpp
# Opt level: O2

Complex __thiscall libDAI::IJGP::logZ(IJGP *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined8 extraout_RDX;
  long lVar2;
  size_t beta;
  ulong uVar3;
  long lVar4;
  pointer pVVar5;
  Complex CVar6;
  TFactor<double> local_a0;
  TFactor<double> local_68;
  
  lVar2 = 0x20;
  uVar3 = 0;
  lVar4 = lVar2;
  while( true ) {
    iVar1 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    if ((ulong)((*(long *)(CONCAT44(extraout_var,iVar1) + 0x100) -
                *(long *)(CONCAT44(extraout_var,iVar1) + 0xf8)) / 0x28) <= uVar3) break;
    iVar1 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    pVVar5 = *(pointer *)(*(long *)(CONCAT44(extraout_var_00,iVar1) + 0xf8) + lVar4);
    local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_start = pVVar5;
    TProb<double>::entropy
              ((TProb<double> *)
               ((long)&(((this->_Qb).
                         super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar2));
    local_a0._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_start = pVVar5;
    std::operator*((complex<double> *)&local_68,(complex<double> *)&local_a0);
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + 0x38;
    lVar4 = lVar4 + 0x28;
  }
  lVar2 = 0x20;
  lVar4 = 0;
  uVar3 = 0;
  while( true ) {
    iVar1 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    CVar6._M_value._0_8_ = CONCAT44(extraout_var_01,iVar1);
    if ((ulong)(*(long *)(CVar6._M_value._0_8_ + 0xe8) - *(long *)(CVar6._M_value._0_8_ + 0xe0) >> 6
               ) <= uVar3) break;
    iVar1 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    pVVar5 = *(pointer *)(*(long *)(CONCAT44(extraout_var_02,iVar1) + 0xe0) + 0x38 + lVar4);
    local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_start = pVVar5;
    TProb<double>::entropy
              ((TProb<double> *)
               ((long)&(((this->_Qa).
                         super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar2));
    local_a0._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
    super__Vector_impl_data._M_start = pVVar5;
    std::operator*((complex<double> *)&local_68,(complex<double> *)&local_a0);
    iVar1 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
    TFactor<double>::log0
              (&local_a0,
               (TFactor<double> *)(*(long *)(CONCAT44(extraout_var_03,iVar1) + 0xe0) + lVar4));
    TFactor<double>::operator*
              (&local_68,&local_a0,
               (TFactor<double> *)
               ((long)(this->_Qa).
                      super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar2 + -0x20));
    TProb<double>::totalSum(&local_68._p);
    TFactor<double>::~TFactor(&local_68);
    TFactor<double>::~TFactor(&local_a0);
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + 0x38;
    lVar4 = lVar4 + 0x40;
  }
  CVar6._M_value._8_8_ = extraout_RDX;
  return (Complex)CVar6._M_value;
}

Assistant:

Complex IJGP::logZ() const {
        Complex sum = 0.0;
        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ )
            sum += Complex(grm().IR(beta).c()) * _Qb[beta].entropy();
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ ) {
            sum += Complex(grm().OR(alpha).c()) * _Qa[alpha].entropy();
            sum += (grm().OR(alpha).log0() * _Qa[alpha]).totalSum();
        }
        return sum;
    }